

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-sp3.c
# Opt level: O2

void coda_sp3_done(void)

{
  coda_type *type;
  long lVar1;
  void *__ptr;
  long in_FS_OFFSET;
  
  __ptr = *(void **)(in_FS_OFFSET + -0x1c0);
  if (__ptr != (void *)0x0) {
    for (lVar1 = 0; lVar1 != 0x4b; lVar1 = lVar1 + 1) {
      type = *(coda_type **)((long)__ptr + lVar1 * 8);
      if (type != (coda_type *)0x0) {
        coda_type_release(type);
        __ptr = *(void **)(in_FS_OFFSET + -0x1c0);
        *(undefined8 *)((long)__ptr + lVar1 * 8) = 0;
      }
    }
    free(__ptr);
    *(undefined8 *)(in_FS_OFFSET + -0x1c0) = 0;
  }
  return;
}

Assistant:

void coda_sp3_done(void)
{
    int i;

    if (sp3_type == NULL)
    {
        return;
    }
    for (i = 0; i < num_sp3_types; i++)
    {
        if (sp3_type[i] != NULL)
        {
            coda_type_release(sp3_type[i]);
            sp3_type[i] = NULL;
        }
    }
    free(sp3_type);
    sp3_type = NULL;
}